

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQFuncState * __thiscall SQFuncState::PushChildState(SQFuncState *this,SQSharedState *ss)

{
  SQFuncState *child;
  SQFuncState *local_20;
  
  local_20 = (SQFuncState *)sq_malloc(0x210);
  SQFuncState(local_20,ss,this,this->_errfunc,this->_errtarget);
  sqvector<SQFuncState_*>::push_back(&this->_childstates,&local_20);
  return local_20;
}

Assistant:

SQFuncState *SQFuncState::PushChildState(SQSharedState *ss)
{
    SQFuncState *child = (SQFuncState *)sq_malloc(sizeof(SQFuncState));
    new (child) SQFuncState(ss,this,_errfunc,_errtarget);
    _childstates.push_back(child);
    return child;
}